

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma_analysis.cpp
# Opt level: O0

compile_errcode __thiscall Factor::Parse(Factor *this)

{
  LogTools *pLVar1;
  allocator local_169;
  string local_168;
  allocator local_141;
  string local_140;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  undefined1 local_a0 [8];
  string str;
  string local_78;
  allocator local_41;
  string local_40;
  SymbolName local_20;
  compile_errcode local_1c;
  SymbolName name;
  int ret;
  Factor *this_local;
  
  local_1c = 0;
  _name = this;
  local_20 = SymbolQueue::GetCurrentName(handle_symbol_queue);
  pLVar1 = g_log_tools;
  switch(local_20) {
  case L_CIRCLE_BRACKET_SYM:
    SymbolQueue::NextSymbol(handle_symbol_queue);
    local_1c = Expression::Parse(&this->m_expression);
    pLVar1 = g_log_tools;
    if (local_1c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_140,"expected a valid expression in bracket",&local_141);
      GrammaErrorLogs(pLVar1,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      return -1;
    }
    local_20 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    pLVar1 = g_log_tools;
    if (local_20 != R_CIRCLE_BRACKET_SYM) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_118,"expected a \')\'",&local_119);
      GrammaErrorLogs(pLVar1,&local_118);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      return -1;
    }
    local_20 = R_CIRCLE_BRACKET_SYM;
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_168,"invalid symbol in factor parse",&local_169);
    GrammaErrorLogs(pLVar1,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
    return -1;
  case CHARACTER_SYM:
    break;
  case IDENTIFIER_SYM:
    SymbolQueue::SetCacheLocate(handle_symbol_queue);
    SymbolQueue::NextSymbol(handle_symbol_queue);
    local_20 = SymbolQueue::GetCurrentName(handle_symbol_queue);
    if (local_20 == L_SQUARE_BRACKET_SYM) {
      SymbolQueue::NextSymbol(handle_symbol_queue);
      local_1c = Expression::Parse(&this->m_expression);
      pLVar1 = g_log_tools;
      if (local_1c != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_78,"expected a valid array index expression",
                   (allocator *)(str.field_2._M_local_buf + 0xf));
        GrammaErrorLogs(pLVar1,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator((allocator<char> *)(str.field_2._M_local_buf + 0xf));
        return -1;
      }
      local_20 = SymbolQueue::GetCurrentName(handle_symbol_queue);
      pLVar1 = g_log_tools;
      if (local_20 != R_SQUARE_BRACKET_SYM) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_40,"expected a \']\'",&local_41);
        GrammaErrorLogs(pLVar1,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        std::allocator<char>::~allocator((allocator<char> *)&local_41);
        return -1;
      }
      local_20 = R_SQUARE_BRACKET_SYM;
    }
    else if (local_20 == L_CIRCLE_BRACKET_SYM) {
      SymbolQueue::NextSymbol(handle_symbol_queue);
      local_1c = ValueArgumentList::Parse(&this->m_value_argument_list);
      pLVar1 = g_log_tools;
      if (local_1c != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_f0,"expected a valid value argument list",&local_f1);
        GrammaErrorLogs(pLVar1,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_f1);
        return -1;
      }
      local_20 = SymbolQueue::GetCurrentName(handle_symbol_queue);
      pLVar1 = g_log_tools;
      if (local_20 != R_CIRCLE_BRACKET_SYM) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_c8,"expected a \')\'",&local_c9);
        GrammaErrorLogs(pLVar1,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_c9);
        return -1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_a0,"This is a function call",&local_a1);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      LogTools::GrammaNormalLogs(g_log_tools,(string *)local_a0);
      std::__cxx11::string::~string((string *)local_a0);
    }
    else {
      SymbolQueue::SetCurrentLocate(handle_symbol_queue);
    }
    break;
  case INTERGER_SYM:
  }
  SymbolQueue::NextSymbol(handle_symbol_queue);
  return 0;
}

Assistant:

compile_errcode Factor::Parse() {
    int ret = COMPILE_OK;
    SymbolName name = handle_symbol_queue->GetCurrentName();
    switch (name) {
        case INTERGER_SYM: break;
        case CHARACTER_SYM: break;
        case IDENTIFIER_SYM: {
            handle_symbol_queue->SetCacheLocate();
            handle_symbol_queue->NextSymbol();
            name = handle_symbol_queue->GetCurrentName();
            if (name == L_SQUARE_BRACKET_SYM) {
                handle_symbol_queue->NextSymbol();
                if ((ret = m_expression.Parse()) == COMPILE_OK) {
                    // m_expression.LogOutput();
                    name = handle_symbol_queue->GetCurrentName();
                    if (name == R_SQUARE_BRACKET_SYM) {
                        break;
                    } else {
                        GrammaErrorLogs(g_log_tools, "expected a ']'");
                        return NOT_MATCH;
                    }
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid array index expression");
                    return NOT_MATCH;
                }
            } else if (name == L_CIRCLE_BRACKET_SYM) {
                handle_symbol_queue->NextSymbol();
                if ((ret = m_value_argument_list.Parse()) == COMPILE_OK) {
                    // m_value_argument_list.LogOutput();
                    name = handle_symbol_queue->GetCurrentName();
                    if (name == R_CIRCLE_BRACKET_SYM) {
                        string str = "This is a function call";
                        g_log_tools->GrammaNormalLogs(str);
                        break;
                    } else {
                        GrammaErrorLogs(g_log_tools, "expected a ')'");
                        return NOT_MATCH;
                    }
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a valid value argument list");
                    return NOT_MATCH;
                }
            } else {
                handle_symbol_queue->SetCurrentLocate();
                break;
            }
        }
        case L_CIRCLE_BRACKET_SYM: {
            handle_symbol_queue->NextSymbol();
            if ((ret = m_expression.Parse()) == COMPILE_OK) {
                // m_expression.LogOutput();
                name = handle_symbol_queue->GetCurrentName();
                if (name == R_CIRCLE_BRACKET_SYM) {
                    break;
                } else {
                    GrammaErrorLogs(g_log_tools, "expected a ')'");
                    return NOT_MATCH;
                }
            } else {
                GrammaErrorLogs(g_log_tools, "expected a valid expression in bracket");
                return NOT_MATCH;
            }
        }
        default: {
            GrammaErrorLogs(g_log_tools, "invalid symbol in factor parse");
            return NOT_MATCH;
        }
    }
    handle_symbol_queue->NextSymbol();
    return COMPILE_OK;
}